

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O3

int __thiscall
cppcms::applications_pool::mount
          (applications_pool *this,char *__special_file,char *__dir,char *__fstype,ulong __rwflag,
          void *__data)

{
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar1;
  undefined8 local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  mount_point local_38;
  
  local_48 = *(undefined8 *)__special_file;
  local_40 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(__special_file + 8);
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_40->_M_use_count = local_40->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_40->_M_use_count = local_40->_M_use_count + 1;
    }
  }
  mount_point::mount_point(&local_38);
  mount(this,(char *)&local_48,(char *)&local_38,(char *)((ulong)__dir & 0xffffffff),__rwflag,__data
       );
  mount_point::~mount_point(&local_38);
  iVar1 = extraout_EAX;
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
    iVar1 = extraout_EAX_00;
  }
  return iVar1;
}

Assistant:

void applications_pool::mount(booster::shared_ptr<application_specific_pool> gen,int flags)
{
	mount(gen,mount_point(),flags);
}